

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_char_*> * __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_char_*> *__return_storage_ptr__,PolymorphicMatcher *this)

{
  MonomorphicImpl<const_char_*> *this_00;
  
  this_00 = (MonomorphicImpl<const_char_*> *)operator_new(0x30);
  PolymorphicMatcher<testing::internal::StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::MonomorphicImpl<const_char_*>::MonomorphicImpl
            (this_00,(StrEqualityMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this);
  (__return_storage_ptr__->super_MatcherBase<const_char_*>).impl_.value_ =
       (MatcherInterface<const_char_*> *)this_00;
  (__return_storage_ptr__->super_MatcherBase<const_char_*>).impl_.link_.next_ =
       &(__return_storage_ptr__->super_MatcherBase<const_char_*>).impl_.link_;
  (__return_storage_ptr__->super_MatcherBase<const_char_*>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0016f248;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<T>(impl_));
  }